

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

size_t showHelpIntro(poptContext con,FILE *fp)

{
  poptArgv ppcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  
  POPT_fprintf(fp,"%s","Usage:");
  sVar5 = 6;
  if ((((con->flags & 2) == 0) && (ppcVar1 = con->optionStack[0].argv, ppcVar1 != (poptArgv)0x0)) &&
     (pcVar3 = *ppcVar1, pcVar3 != (char *)0x0)) {
    pcVar2 = strchr(pcVar3,0x2f);
    if (pcVar2 != (char *)0x0) {
      pcVar3 = strrchr(pcVar3,0x2f);
      pcVar3 = pcVar3 + 1;
    }
    fprintf((FILE *)fp," %s",pcVar3);
    sVar4 = strlen(pcVar3);
    sVar5 = sVar4 + 7;
  }
  return sVar5;
}

Assistant:

static size_t showHelpIntro(poptContext con, FILE * fp)
{
    const char *usage_str = POPT_("Usage:");
    size_t len = strlen(usage_str);
    POPT_fprintf(fp, "%s", usage_str);

    if (!(con->flags & POPT_CONTEXT_KEEP_FIRST)) {
	struct optionStackEntry * os = con->optionStack;
	const char * fn = (os->argv ? os->argv[0] : NULL);
	if (fn == NULL) return len;
	if (strchr(fn, '/')) fn = strrchr(fn, '/') + 1;
	/* XXX POPT_fprintf not needed for argv[0] display. */
	fprintf(fp, " %s", fn);
	len += strlen(fn) + 1;
    }

    return len;
}